

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O0

int ndn_name_append_name(ndn_name_t *lhs,ndn_name_t *rhs)

{
  int local_24;
  int i;
  ndn_name_t *rhs_local;
  ndn_name_t *lhs_local;
  
  if ((uint)lhs->components_size + (uint)rhs->components_size < 0xb) {
    for (local_24 = 0; local_24 < (int)(uint)rhs->components_size; local_24 = local_24 + 1) {
      memcpy(lhs->components + lhs->components_size,rhs->components + local_24,0x2c);
      lhs->components_size = lhs->components_size + '\x01';
    }
    lhs_local._4_4_ = 0;
  }
  else {
    lhs_local._4_4_ = -10;
  }
  return lhs_local._4_4_;
}

Assistant:

int
ndn_name_append_name(ndn_name_t* lhs, const ndn_name_t* rhs)
{
  if (lhs->components_size + rhs->components_size <= NDN_NAME_COMPONENTS_SIZE) {
    for (int i = 0; i < rhs->components_size; i++) {
      memcpy(&lhs->components[lhs->components_size], &rhs->components[i], sizeof(name_component_t));
      lhs->components_size++;
    }
    return 0;
  }
  else
    return NDN_OVERSIZE;
}